

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void __thiscall
LLVMBC::ShuffleVectorInst::ShuffleVectorInst
          (ShuffleVectorInst *this,Type *type,Value *a,Value *b,Value *shuf)

{
  pointer ptr;
  iterator __position;
  ValueKind VVar1;
  uint uVar2;
  uint uVar3;
  pointer ppVVar4;
  ConstantDataVector *this_00;
  Constant *pCVar5;
  APInt *this_01;
  int64_t iVar6;
  LoggingCallback p_Var7;
  void *pvVar8;
  int local_1038 [3];
  undefined3 uStack_102b;
  undefined5 uStack_1028;
  char acStack_1023 [4083];
  
  Value::Value((Value *)this,type,ShuffleVector);
  (this->super_Instruction).is_terminator = false;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Instruction).attachments._M_h._M_buckets =
       &(this->super_Instruction).attachments._M_h._M_single_bucket;
  (this->super_Instruction).attachments._M_h._M_bucket_count = 1;
  (this->super_Instruction).attachments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_Instruction).attachments._M_h._M_element_count = 0;
  (this->super_Instruction).attachments._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_Instruction).attachments._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_Instruction).attachments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->shuffle_mask).super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shuffle_mask).super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->shuffle_mask).super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVVar4 = (pointer)::dxil_spv::allocate_in_thread(0x10);
  *ppVVar4 = a;
  ppVVar4[1] = b;
  ptr = (this->super_Instruction).operands.
        super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>.
        _M_impl.super__Vector_impl_data._M_start;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppVVar4;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar4 + 2;
  (this->super_Instruction).operands.
  super__Vector_base<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = ppVVar4 + 2;
  if (ptr != (pointer)0x0) {
    ::dxil_spv::free_in_thread(ptr);
  }
  this_00 = (ConstantDataVector *)Internal::resolve_proxy(shuf);
  VVar1 = Value::get_value_kind((Value *)this_00);
  if (VVar1 == ConstantDataVector) {
    uVar2 = ConstantDataVector::getNumElements(this_00);
    std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::reserve
              (&this->shuffle_mask,(ulong)uVar2);
    uVar2 = ConstantDataVector::getNumElements(this_00);
    if (uVar2 != 0) {
      uVar2 = 0;
      do {
        pCVar5 = ConstantDataVector::getElementAsConstant(this_00,uVar2);
        pCVar5 = (Constant *)Internal::resolve_proxy(&pCVar5->super_Value);
        VVar1 = Value::get_value_kind((Value *)pCVar5);
        if (VVar1 != ConstantInt) {
          p_Var7 = ::dxil_spv::get_thread_log_callback();
          if (p_Var7 == (LoggingCallback)0x0) {
            LLVMBC::ShuffleVectorInst();
            std::terminate();
          }
          goto LAB_001821bd;
        }
        this_01 = Constant::getUniqueInteger(pCVar5);
        iVar6 = APInt::getSExtValue(this_01);
        local_1038[0] = (int)iVar6;
        __position._M_current =
             (this->shuffle_mask).super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->shuffle_mask).super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::_M_realloc_insert<int>
                    (&this->shuffle_mask,__position,local_1038);
        }
        else {
          *__position._M_current = (int)iVar6;
          (this->shuffle_mask).super__Vector_base<int,_dxil_spv::ThreadLocalAllocator<int>_>._M_impl
          .super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar2 = uVar2 + 1;
        uVar3 = ConstantDataVector::getNumElements(this_00);
      } while (uVar2 < uVar3);
    }
    return;
  }
  p_Var7 = ::dxil_spv::get_thread_log_callback();
  if (p_Var7 == (LoggingCallback)0x0) {
    LLVMBC::ShuffleVectorInst();
    std::terminate();
  }
LAB_001821bd:
  uStack_1028 = 0x6163206e69;
  builtin_strncpy(acStack_1023,"st<T>.\n",8);
  local_1038._0_8_ = 0x2064696c61766e49;
  stack0xffffffffffffefd0 = 0x2065707974;
  uStack_102b = 0x204449;
  pvVar8 = ::dxil_spv::get_thread_log_callback_userdata();
  (*p_Var7)(pvVar8,Error,(char *)local_1038);
  std::terminate();
}

Assistant:

ShuffleVectorInst::ShuffleVectorInst(Type *type, Value *a, Value *b, Value *shuf)
	: Instruction(type, ValueKind::ShuffleVector)
{
	set_operands({ a, b });
	auto *masks = cast<ConstantDataVector>(shuf);
	shuffle_mask.reserve(masks->getNumElements());
	for (unsigned i = 0; i < masks->getNumElements(); i++)
		shuffle_mask.push_back(cast<ConstantInt>(masks->getElementAsConstant(i))->getUniqueInteger().getSExtValue());
}